

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolarDecomposition.cpp
# Opt level: O1

btScalar anon_unknown.dwarf_6e0f9::p1_norm(btMatrix3x3 *a)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar1 = *(undefined8 *)a->m_el[0].m_floats;
  uVar2 = *(undefined8 *)a->m_el[1].m_floats;
  uVar3 = *(undefined8 *)a->m_el[2].m_floats;
  fVar4 = ABS((float)uVar3) + ABS((float)uVar2) + ABS((float)uVar1);
  fVar5 = ABS((float)((ulong)uVar3 >> 0x20)) +
          ABS((float)((ulong)uVar2 >> 0x20)) + ABS((float)((ulong)uVar1 >> 0x20));
  fVar6 = ABS(a->m_el[2].m_floats[2]) + ABS(a->m_el[1].m_floats[2]) + ABS(a->m_el[0].m_floats[2]);
  if (fVar4 <= fVar5) {
    fVar4 = fVar5;
  }
  if (fVar4 <= fVar6) {
    fVar4 = fVar6;
  }
  return fVar4;
}

Assistant:

btScalar abs_column_sum(const btMatrix3x3& a, int i)
  {
    return btFabs(a[0][i]) + btFabs(a[1][i]) + btFabs(a[2][i]);
  }